

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<NULLCRef,_false,_false>::grow_and_add
          (FastVector<NULLCRef,_false,_false> *this,uint newSize,NULLCRef *val)

{
  uint uVar1;
  uint uVar2;
  NULLCRef *ptr;
  NULLCRef *pNVar3;
  uint oldMax;
  NULLCRef *oldData;
  NULLCRef *val_local;
  uint newSize_local;
  FastVector<NULLCRef,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  pNVar3 = this->data;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  *(undefined8 *)(pNVar3 + uVar2) = *(undefined8 *)val;
  *(undefined4 *)((long)&pNVar3[uVar2].ptr + 4) = *(undefined4 *)((long)&val->ptr + 4);
  if (ptr != (NULLCRef *)0x0) {
    NULLC::destruct<NULLCRef>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}